

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

MIPMap * pbrt::ImageTextureBase::GetTexture
                   (string *filename,string *filter,Float maxAniso,WrapMode wrap,
                   ColorEncodingHandle *encoding,Allocator alloc)

{
  undefined8 __p;
  FilterFunction FVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  __uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *this;
  MIPMap *pMVar5;
  unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> mipmap;
  unique_lock<std::mutex> lock;
  TexInfo texInfo;
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  MIPMapFilterOptions local_a8;
  unique_lock<std::mutex> local_a0;
  TexInfo local_90;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  local_38.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  local_c0._20_4_ = maxAniso;
  TexInfo::TexInfo(&local_90,filename,filter,maxAniso,wrap,(ColorEncodingHandle *)&local_38);
  local_a0._M_device = (mutex_type *)textureCacheMutex;
  local_a0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_a0);
  local_a0._M_owns = true;
  iVar3 = std::
          _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
          ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                  *)textureCache,&local_90);
  if (iVar3._M_node == (_Base_ptr)(textureCache + 8)) {
    std::unique_lock<std::mutex>::unlock(&local_a0);
    local_a8.filter = EWA;
    local_a8.maxAnisotropy = (Float)local_c0._20_4_;
    iVar2 = std::__cxx11::string::compare((char *)filter);
    FVar1 = EWA;
    if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)filter), iVar2 != 0)) {
      iVar2 = std::__cxx11::string::compare((char *)filter);
      if (iVar2 == 0) {
        FVar1 = Trilinear;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)filter);
        if (iVar2 == 0) {
          FVar1 = Bilinear;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)filter);
          if (iVar2 == 0) {
            FVar1 = Point;
          }
          else {
            local_d0._8_8_ = (Image *)0x0;
            local_c0[0] = '\0';
            local_d0._0_8_ = (pointer)local_c0;
            detail::stringPrintfRecursive<std::__cxx11::string_const&>
                      ((string *)local_d0,"%s: filter function unknown",filter);
            Warning((FileLoc *)0x0,(char *)local_d0._0_8_);
            FVar1 = local_a8.filter;
            if ((pointer)local_d0._0_8_ != (pointer)local_c0) {
              operator_delete((void *)local_d0._0_8_,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
              FVar1 = local_a8.filter;
            }
          }
        }
      }
    }
    local_a8.filter = FVar1;
    local_40.bits =
         (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
    MIPMap::CreateFromFile
              ((MIPMap *)local_d0,filename,&local_a8,wrap,(ColorEncodingHandle *)&local_40,alloc);
    if ((pointer)local_d0._0_8_ == (pointer)0x0) {
      pMVar5 = (MIPMap *)0x0;
    }
    else {
      std::unique_lock<std::mutex>::lock(&local_a0);
      iVar3 = std::
              _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
              ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                      *)textureCache,&local_90);
      if (iVar3._M_node != (_Base_ptr)(textureCache + 8)) {
        LogFatal<char_const(&)[49]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                   ,0x19c,"Check failed: %s",
                   (char (*) [49])"textureCache.find(texInfo) == textureCache.end()");
      }
      this = (__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
             std::
             map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
             ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                           *)textureCache,&local_90);
      __p = local_d0._0_8_;
      local_d0._0_8_ = (pointer)0x0;
      std::__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::reset
                (this,(pointer)__p);
      pmVar4 = std::
               map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
               ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                             *)textureCache,&local_90);
      pMVar5 = (pmVar4->_M_t).
               super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>._M_t.
               super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
               super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl;
    }
    std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::~unique_ptr
              ((unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)local_d0);
  }
  else {
    pmVar4 = std::
             map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
             ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                           *)textureCache,&local_90);
    pMVar5 = (pmVar4->_M_t).super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>.
             _M_t.super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
             super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.filter._M_dataplus._M_p != &local_90.filter.field_2) {
    operator_delete(local_90.filter._M_dataplus._M_p,
                    local_90.filter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.filename._M_dataplus._M_p != &local_90.filename.field_2) {
    operator_delete(local_90.filename._M_dataplus._M_p,
                    local_90.filename.field_2._M_allocated_capacity + 1);
  }
  return pMVar5;
}

Assistant:

MIPMap *ImageTextureBase::GetTexture(const std::string &filename,
                                     const std::string &filter, Float maxAniso,
                                     WrapMode wrap, ColorEncodingHandle encoding,
                                     Allocator alloc) {
    // Return _MIPMap_ from texture cache if present
    TexInfo texInfo(filename, filter, maxAniso, wrap, encoding);
    std::unique_lock<std::mutex> lock(textureCacheMutex);
    if (textureCache.find(texInfo) != textureCache.end())
        return textureCache[texInfo].get();
    else
        lock.unlock();

    // Create _MIPMap_ for _filename_
    MIPMapFilterOptions options;
    options.maxAnisotropy = maxAniso;

    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        options.filter = *ff;
    else
        Warning("%s: filter function unknown", filter);

    std::unique_ptr<MIPMap> mipmap =
        MIPMap::CreateFromFile(filename, options, wrap, encoding, alloc);
    if (mipmap) {
        lock.lock();
        // This is actually ok, but if it hits, it means we've wastefully
        // loaded this texture. (Note that in that case, should just return
        // the one that's already in there and not replace it.)
        CHECK(textureCache.find(texInfo) == textureCache.end());
        textureCache[texInfo] = std::move(mipmap);

        return textureCache[texInfo].get();
    } else
        return nullptr;
}